

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

void __thiscall tiger::trains::world::World::~World(World *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppIVar2;
  pointer ppTVar3;
  pointer ppPVar4;
  Player *pPVar5;
  pointer pcVar6;
  pointer ppPVar7;
  pointer ppLVar8;
  pointer pvVar9;
  pointer ppIVar10;
  pointer ppIVar11;
  pointer ppIVar12;
  pointer ppTVar13;
  pointer ppPVar14;
  pointer ppLVar15;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *eventList
  ;
  pointer ppPVar16;
  pointer pvVar17;
  
  this->_vptr_World = (_func_int **)&PTR__World_00182bc0;
  ppIVar2 = (this->postList).
            super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar12 = (this->postList).
                  super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppIVar12 != ppIVar2;
      ppIVar12 = ppIVar12 + 1) {
    if (*ppIVar12 != (IPost *)0x0) {
      (*(*ppIVar12)->_vptr_IPost[1])();
    }
  }
  ppTVar3 = (this->trainList).
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar13 = (this->trainList).
                  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar13 != ppTVar3;
      ppTVar13 = ppTVar13 + 1) {
    if (*ppTVar13 != (Train *)0x0) {
      (*((*ppTVar13)->super_IUpgradeble)._vptr_IUpgradeble[1])();
    }
  }
  ppPVar4 = (this->playerList).
            super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar16 = (this->playerList).
                  super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppPVar16 != ppPVar4;
      ppPVar16 = ppPVar16 + 1) {
    pPVar5 = *ppPVar16;
    if (pPVar5 != (Player *)0x0) {
      pcVar6 = (pPVar5->idx)._M_dataplus._M_p;
      paVar1 = &(pPVar5->idx).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar6 != paVar1) {
        operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
      }
      pcVar6 = (pPVar5->name)._M_dataplus._M_p;
      paVar1 = &(pPVar5->name).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar6 != paVar1) {
        operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
      }
    }
    operator_delete(pPVar5,0x48);
  }
  ppPVar7 = (this->pointList).
            super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar14 = (this->pointList).
                  super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppPVar14 != ppPVar7;
      ppPVar14 = ppPVar14 + 1) {
    operator_delete(*ppPVar14,0x18);
  }
  ppLVar8 = (this->lineList).
            super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar15 = (this->lineList).
                  super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppLVar15 != ppLVar8;
      ppLVar15 = ppLVar15 + 1) {
    operator_delete(*ppLVar15,0x20);
  }
  pvVar9 = (this->eventsHistory).
           super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar17 = (this->eventsHistory).
                 super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar17 != pvVar9; pvVar17 = pvVar17 + 1
      ) {
    ppIVar10 = (pvVar17->
               super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar11 = (pvVar17->
                    super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppIVar11 != ppIVar10;
        ppIVar11 = ppIVar11 + 1) {
      if (*ppIVar11 != (IEvent *)0x0) {
        (*(*ppIVar11)->_vptr_IEvent[1])();
      }
    }
  }
  std::
  vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  ::~vector(&this->eventsHistory);
  std::
  _Rb_tree<const_tiger::trains::world::Player_*,_std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>,_std::_Select1st<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  ::~_Rb_tree(&(this->trainsOfPlayer)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Line_*,_std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>,_std::_Select1st<std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>,_std::less<const_tiger::trains::world::Line_*>,_std::allocator<std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  ::~_Rb_tree(&(this->trainsOfLine)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Point_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  ::~_Rb_tree(&(this->pointOfPost)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_int>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::~_Rb_tree(&(this->postOfPoint)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
  ::~_Rb_tree(&(this->playerOfName)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Player_*,_std::pair<const_tiger::trains::world::Player_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Player_*const,_int>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_int>_>_>
  ::~_Rb_tree(&(this->homes)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>_>_>
  ::~_Rb_tree(&(this->graph)._M_t);
  ppLVar15 = (this->lineList).
             super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppLVar15 != (pointer)0x0) {
    operator_delete(ppLVar15,(long)(this->lineList).
                                   super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppLVar15);
  }
  ppPVar14 = (this->pointList).
             super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar14 != (pointer)0x0) {
    operator_delete(ppPVar14,(long)(this->pointList).
                                   super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppPVar14);
  }
  ppIVar12 = (this->postList).
             super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar12 != (pointer)0x0) {
    operator_delete(ppIVar12,(long)(this->postList).
                                   super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar12);
  }
  ppTVar13 = (this->trainList).
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar13 != (pointer)0x0) {
    operator_delete(ppTVar13,(long)(this->trainList).
                                   super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppTVar13);
  }
  ppPVar16 = (this->playerList).
             super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar16 != (pointer)0x0) {
    operator_delete(ppPVar16,(long)(this->playerList).
                                   super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppPVar16);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Train_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Train_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Train_*>_>_>
  ::~_Rb_tree(&(this->trainMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Line_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Line_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Line_*>_>_>
  ::~_Rb_tree(&(this->lineMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Point_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  ::~_Rb_tree(&(this->pointMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
  ::~_Rb_tree(&(this->playerMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::IPost_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::IPost_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::IPost_*>_>_>
  ::~_Rb_tree(&(this->postMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->nameScoreMap)._M_t);
  std::
  _Rb_tree<tiger::trains::world::Player_*,_std::pair<tiger::trains::world::Player_*const,_int>,_std::_Select1st<std::pair<tiger::trains::world::Player_*const,_int>_>,_std::less<tiger::trains::world::Player_*>,_std::allocator<std::pair<tiger::trains::world::Player_*const,_int>_>_>
  ::~_Rb_tree(&(this->scoreMap)._M_t);
  return;
}

Assistant:

World::~World()
{
    for (IPost *post : getPostList())
        delete post;

    for (Train *train : getTrainList())
        delete train;

    for (Player *player : getPlayerList())
        delete player;

    for (Point *point : getPointList())
        delete point;

    for (Line *line : getLineList())
        delete line;

    for (std::vector<IEvent *> &eventList : eventsHistory)
        for (IEvent *event : eventList)
            delete event;
}